

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v11::format_system_error(buffer<char> *out,int error_code,char *message)

{
  basic_appender<char> out_00;
  error_code __ec;
  error_category *__cat;
  int in_ESI;
  buffer<char> *in_RDI;
  error_code ec;
  char *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  system_error local_60 [40];
  char *in_stack_ffffffffffffffc8;
  basic_appender<char> in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  error_category *in_stack_ffffffffffffffe0;
  
  __cat = (error_category *)std::_V2::generic_category();
  std::error_code::error_code((error_code *)&stack0xffffffffffffffd8,in_ESI,__cat);
  basic_appender<char>::basic_appender((basic_appender<char> *)&stack0xffffffffffffffd0,in_RDI);
  __ec._M_cat = in_stack_ffffffffffffffe0;
  __ec._M_value = (int)in_stack_ffffffffffffffd8;
  __ec._4_4_ = SUB84(in_stack_ffffffffffffffd8,4);
  std::system_error::system_error
            ((system_error *)in_stack_ffffffffffffffd0.container,__ec,in_stack_ffffffffffffffc8);
  std::runtime_error::what();
  out_00.container._4_4_ = in_ESI;
  out_00.container._0_4_ = in_stack_ffffffffffffff68;
  detail::write<char,fmt::v11::basic_appender<char>>(out_00,in_stack_ffffffffffffff60);
  std::system_error::~system_error(local_60);
  return;
}

Assistant:

FMT_FUNC void format_system_error(detail::buffer<char>& out, int error_code,
                                  const char* message) noexcept {
  FMT_TRY {
    auto ec = std::error_code(error_code, std::generic_category());
    detail::write(appender(out), std::system_error(ec, message).what());
    return;
  }